

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t __thiscall kratos::HashVisitor::produce_hash(HashVisitor *this)

{
  bool bVar1;
  void *key;
  uint64_t uVar2;
  reference puVar3;
  unsigned_long *input;
  size_type sVar4;
  uint64_t result;
  uint64_t var;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint64_t var_hash;
  HashVisitor *this_local;
  
  key = (void *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::size();
  uVar2 = hash_64_fnv1a(key,uVar2);
  __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(uVar2 << 0x20);
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->var_hashes_);
  var = (uint64_t)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->var_hashes_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&var);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((ulong)__range2 ^ *puVar3);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  input = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(&this->stmt_hashes_);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->stmt_hashes_);
  uVar2 = XXHash64::hash(input,sVar4 << 3,(uint64_t)__range2);
  return uVar2;
}

Assistant:

uint64_t produce_hash() {
        // use generator name as a seed
        uint64_t var_hash = hash_64_fnv1a(root_->name.c_str(), root_->name.size()) << 32u;
        for (const uint64_t var : var_hashes_) var_hash = var_hash ^ var;
        // use var_hash as a seed
        // FIXME: do we really need to hash in chunks? or can we use xor to ignore the ordering
        //  of the blocks?
        uint64_t result =
            XXHash64::hash(stmt_hashes_.data(), stmt_hashes_.size() * sizeof(uint64_t), var_hash);
        return result;
    }